

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::pumpTo
          (BlockedPumpFrom *this,AsyncOutputStream *output,uint64_t amount2)

{
  SourceLocation location;
  bool bVar1;
  unsigned_long in_RCX;
  SourceLocation local_b0;
  Type local_98;
  Type local_88;
  unsigned_long local_78;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> local_70;
  Type local_68;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> n;
  Fault local_38;
  Fault f;
  unsigned_long uStack_28;
  DebugExpression<bool> _kjCondition;
  uint64_t amount2_local;
  AsyncOutputStream *output_local;
  BlockedPumpFrom *this_local;
  
  uStack_28 = in_RCX;
  f.exception._6_1_ = Canceler::isEmpty((Canceler *)(output + 7));
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x335,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  local_68.amount2 =
       (long)output[5]._vptr_AsyncOutputStream - (long)output[6]._vptr_AsyncOutputStream;
  local_68.n = min<unsigned_long&,unsigned_long>(&stack0xffffffffffffffd8,&local_68.amount2);
  (**(code **)(*output[4]._vptr_AsyncOutputStream + 0x18))
            (&local_68,output[4]._vptr_AsyncOutputStream,amount2,local_68.n);
  local_78 = uStack_28;
  local_70 = local_68.n;
  local_88.fulfiller = (PromiseFulfiller<void> *)output;
  local_88.canceler = (Canceler *)amount2;
  local_98 = (anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<unsigned_long>>
                       ((PromiseFulfiller<unsigned_long> *)output[2]._vptr_AsyncOutputStream,
                        (Canceler *)(output + 7));
  SourceLocation::SourceLocation
            (&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,"pumpTo",0x338,0x1c);
  location.function = local_b0.function;
  location.fileName = local_b0.fileName;
  location.lineNumber = local_b0.lineNumber;
  location.columnNumber = local_b0.columnNumber;
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<unsigned_long>>(kj::PromiseFulfiller<unsigned_long>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>
            ((Promise<unsigned_long> *)&local_68.output,&local_68,&local_88,location);
  Canceler::wrap<unsigned_long>((Canceler *)this,(Promise<unsigned_long> *)(output + 7));
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_68.output);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_68);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount2) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      auto n = kj::min(amount2, amount - pumpedSoFar);
      return canceler.wrap(input.pumpTo(output, n)
          .then([this,&output,amount2,n](uint64_t actual) -> Promise<uint64_t> {
        canceler.release();
        pumpedSoFar += actual;
        KJ_ASSERT(pumpedSoFar <= amount);
        if (pumpedSoFar == amount || actual < n) {
          // Either we pumped all we wanted or we hit EOF.
          fulfiller.fulfill(kj::cp(pumpedSoFar));
          pipe.endState(*this);
          return pipe.pumpTo(output, amount2 - actual)
              .then([actual](uint64_t actual2) { return actual + actual2; });
        }

        // Completed entire pumpTo amount.
        KJ_ASSERT(actual == amount2);
        return amount2;
      }, teeExceptionSize(fulfiller, canceler)));
    }